

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_open(uv_pipe_t *handle,uv_file fd)

{
  int err;
  uv_file fd_local;
  uv_pipe_t *handle_local;
  
  handle_local._4_4_ = uv__nonblock_ioctl(fd,1);
  if (handle_local._4_4_ == 0) {
    handle_local._4_4_ = uv__stream_open((uv_stream_t *)handle,fd,0x60);
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_open(uv_pipe_t* handle, uv_file fd) {
  int err;

  err = uv__nonblock(fd, 1);
  if (err)
    return err;

#if defined(__APPLE__)
  err = uv__stream_try_select((uv_stream_t*) handle, &fd);
  if (err)
    return err;
#endif /* defined(__APPLE__) */

  return uv__stream_open((uv_stream_t*)handle,
                         fd,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
}